

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

int32_t intersect_vector16_cardinality(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int32_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 in_XMM0_Da;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  uVar4 = s_a & 0xfffffffffffffff8;
  uVar8 = s_b & 0xfffffffffffffff8;
  if (uVar8 == 0 || uVar4 == 0) {
    uVar6 = 0;
    uVar7 = 0;
    iVar5 = 0;
  }
  else {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])A);
    auVar9 = ZEXT1664(auVar1);
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])B);
    auVar10 = ZEXT1664(auVar1);
    uVar6 = 0;
    uVar7 = 0;
    iVar5 = 0;
    do {
      if ((A[uVar7] != 0) && (B[uVar6] != 0)) break;
      vpcmpestrm_avx(auVar10._0_16_,auVar9._0_16_,1);
      lVar3 = uVar7 + 7;
      if (B[uVar6 + 7] < A[lVar3]) {
LAB_00118bf7:
        bVar2 = true;
        if (B[uVar6 + 7] <= A[lVar3]) {
          uVar6 = uVar6 + 8;
          if (uVar6 == uVar8) goto LAB_00118c07;
          auVar1 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar6));
          auVar10 = ZEXT1664(auVar1);
        }
      }
      else {
        uVar7 = uVar7 + 8;
        if (uVar7 != uVar4) {
          auVar1 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar7));
          auVar9 = ZEXT1664(auVar1);
          goto LAB_00118bf7;
        }
LAB_00118c07:
        bVar2 = false;
      }
      iVar5 = iVar5 + POPCOUNT(in_XMM0_Da);
    } while (bVar2);
    if (uVar6 < uVar8 && uVar7 < uVar4) {
      do {
        vpcmpistrm_avx(auVar10._0_16_,auVar9._0_16_,1);
        lVar3 = uVar7 + 7;
        if (B[uVar6 + 7] < A[lVar3]) {
LAB_00118c59:
          bVar2 = true;
          if (B[uVar6 + 7] <= A[lVar3]) {
            uVar6 = uVar6 + 8;
            if (uVar6 == uVar8) goto LAB_00118c69;
            auVar1 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar6));
            auVar10 = ZEXT1664(auVar1);
          }
        }
        else {
          uVar7 = uVar7 + 8;
          if (uVar7 != uVar4) {
            auVar1 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar7));
            auVar9 = ZEXT1664(auVar1);
            goto LAB_00118c59;
          }
LAB_00118c69:
          bVar2 = false;
        }
        iVar5 = iVar5 + POPCOUNT(in_XMM0_Da);
      } while (bVar2);
    }
  }
  if (uVar6 < s_b && uVar7 < s_a) {
    do {
      if (A[uVar7] < B[uVar6]) {
        uVar7 = uVar7 + 1;
      }
      else {
        if (A[uVar7] <= B[uVar6]) {
          iVar5 = iVar5 + 1;
          uVar7 = uVar7 + 1;
        }
        uVar6 = uVar6 + 1;
      }
    } while ((uVar7 < s_a) && (uVar6 < s_b));
  }
  return iVar5;
}

Assistant:

int32_t intersect_vector16_cardinality(const uint16_t *__restrict__ A,
                                       size_t s_a,
                                       const uint16_t *__restrict__ B,
                                       size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}